

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Info.cpp
# Opt level: O2

void curlpp::
     InfoTypeConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ::get(Easy *handle,CURLINFO info,string *value)

{
  char *tmp;
  char *local_18;
  
  Easy::getInfo<char*>(handle,info,&local_18);
  std::__cxx11::string::assign((char *)value);
  return;
}

Assistant:

void
InfoTypeConverter<std::string>::get(const curlpp::Easy & handle, 
				      CURLINFO info,
				      std::string & value)
{
  char * tmp;
  InfoGetter::get(handle, info, tmp);
  value = tmp;
}